

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey.c
# Opt level: O2

void ssort2(string *a,int n,int depth)

{
  byte bVar1;
  byte bVar2;
  string puVar3;
  string puVar4;
  ulong uVar5;
  string *ppuVar6;
  string *ppuVar7;
  string *ppuVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  string *c;
  long lVar13;
  string *ppuVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  string *ppuVar18;
  
  uVar11 = (ulong)(uint)n;
  lVar13 = (long)depth;
LAB_002226c6:
  uVar16 = (uint)uVar11;
  ppuVar8 = a;
  if (9 < (int)uVar16) {
    ppuVar7 = a + (uVar11 >> 1 & 0x7fffffff);
    uVar5 = uVar11 & 0xffffffff;
    c = a + (uVar5 - 1);
    ppuVar8 = c;
    ppuVar6 = a;
    if (0x1e < uVar16) {
      uVar11 = (ulong)(uVar16 & 0xfffffff8);
      uVar17 = (ulong)(uVar16 >> 2 & 0xfffffffe);
      ppuVar6 = med3func(a,(string *)(uVar11 + (long)a),a + uVar17,depth);
      ppuVar7 = med3func((string *)((long)ppuVar7 - uVar11),ppuVar7,
                         (string *)((long)ppuVar7 + uVar11),depth);
      ppuVar8 = med3func(c + -uVar17,(string *)((long)c - uVar11),c,depth);
    }
    ppuVar8 = med3func(ppuVar6,ppuVar7,ppuVar8,depth);
    puVar3 = *a;
    *a = *ppuVar8;
    *ppuVar8 = puVar3;
    bVar1 = (*a)[lVar13];
    ppuVar8 = a + 1;
    ppuVar6 = c;
    ppuVar7 = ppuVar8;
LAB_002227c0:
    lVar12 = (long)ppuVar7 << 0x1d;
    ppuVar14 = ppuVar7;
    for (; ppuVar18 = ppuVar6, ppuVar7 <= ppuVar6; ppuVar7 = ppuVar7 + 1) {
      bVar2 = (*ppuVar7)[lVar13];
      if (bVar1 < bVar2) break;
      if (bVar2 == bVar1) {
        puVar3 = *ppuVar8;
        *ppuVar8 = *ppuVar7;
        *ppuVar7 = puVar3;
        ppuVar8 = ppuVar8 + 1;
      }
      lVar12 = lVar12 + 0x100000000;
      ppuVar14 = ppuVar14 + 1;
    }
    do {
      if (ppuVar6 < ppuVar7) {
        lVar9 = (long)ppuVar8 - (long)a >> 3;
        lVar15 = (long)ppuVar14 - (long)ppuVar8 >> 3;
        if (lVar15 <= lVar9) {
          lVar9 = lVar15;
        }
        vecswap2(a,ppuVar7 + -(long)(int)lVar9,(int)lVar9);
        uVar11 = (long)c - (long)ppuVar18 >> 3;
        lVar9 = (long)((long)a + (uVar5 * 8 - (long)c)) >> 3;
        uVar10 = (uint)uVar11;
        uVar16 = (int)lVar9 - 1;
        if ((long)uVar11 < lVar9) {
          uVar16 = uVar10;
        }
        vecswap2(ppuVar7,a + (uVar5 - (long)(int)uVar16),uVar16);
        if (1 < (int)lVar15) {
          ssort2(a,(int)lVar15,depth);
        }
        lVar12 = lVar12 + (long)ppuVar8 * -0x20000000 >> 0x20;
        if (a[lVar12][lVar13] != '\0') {
          ssort2(a + lVar12,
                 (int)((long)a + ((((long)ppuVar8 - (long)a) + uVar5 * 8) - (long)c) >> 3) + -1,
                 depth + 1);
        }
        if ((int)uVar10 < 2) {
          return;
        }
        a = a + (uVar5 - (uVar10 & 0x7fffffff));
        goto LAB_002226c6;
      }
      puVar3 = *ppuVar6;
      if (puVar3[lVar13] < bVar1) goto LAB_0022281d;
      if (puVar3[lVar13] == bVar1) {
        *ppuVar6 = *c;
        *c = puVar3;
        c = c + -1;
      }
      ppuVar6 = ppuVar6 + -1;
      ppuVar18 = ppuVar18 + -1;
    } while( true );
  }
  do {
    if ((int)uVar11 < 2) {
      return;
    }
    ppuVar8 = ppuVar8 + 1;
    uVar11 = (ulong)((int)uVar11 - 1);
    ppuVar6 = ppuVar8;
    while (a < ppuVar6) {
      puVar3 = *ppuVar6;
      lVar12 = lVar13;
      while( true ) {
        bVar1 = ppuVar6[-1][lVar12];
        bVar2 = puVar3[lVar12];
        if ((bVar1 == 0) || (bVar1 != bVar2)) break;
        lVar12 = lVar12 + 1;
      }
      if (bVar1 <= bVar2) break;
      *ppuVar6 = ppuVar6[-1];
      ppuVar6[-1] = puVar3;
      ppuVar6 = ppuVar6 + -1;
    }
  } while( true );
LAB_0022281d:
  puVar4 = *ppuVar7;
  *ppuVar7 = puVar3;
  *ppuVar6 = puVar4;
  ppuVar7 = ppuVar7 + 1;
  ppuVar6 = ppuVar6 + -1;
  goto LAB_002227c0;
}

Assistant:

static void ssort2(string a[], int n, int depth)
{   int d, r, partval;
    string *pa, *pb, *pc, *pd, *pl, *pm, *pn, t;
    if (n < 10) {
        insertsort(a, n, depth);
        return;
    }
    pl = a;
    pm = a + (n/2);
    pn = a + (n-1);
    if (n > 30) { /* On big arrays, pseudomedian of 9 */
        d = (n/8);
        pl = med3(pl, pl+d, pl+2*d);
        pm = med3(pm-d, pm, pm+d);
        pn = med3(pn-2*d, pn-d, pn);
    }
    pm = med3(pl, pm, pn);
    swap2(a, pm);
    partval = ptr2char(a);
    pa = pb = a + 1;
    pc = pd = a + n-1;
    for (;;) {
        while (pb <= pc && (r = ptr2char(pb)-partval) <= 0) {
            if (r == 0) { swap2(pa, pb); pa++; }
            pb++;
        }
        while (pb <= pc && (r = ptr2char(pc)-partval) >= 0) {
            if (r == 0) { swap2(pc, pd); pd--; }
            pc--;
        }
        if (pb > pc) break;
        swap2(pb, pc);
        pb++;
        pc--;
    }
    pn = a + n;
    r = min(pa-a, pb-pa);    vecswap2(a,  pb-r, r);
    r = min(pd-pc, pn-pd-1); vecswap2(pb, pn-r, r);
    if ((r = pb-pa) > 1)
        ssort2(a, r, depth);
    if (ptr2char(a + r) != 0)
        ssort2(a + r, pa-a + pn-pd-1, depth+1);
    if ((r = pd-pc) > 1)
        ssort2(a + n-r, r, depth);
}